

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
          (optional<tinyusdz::Interpolation> *this,optional<tinyusdz::Interpolation> *other)

{
  value_type vVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  optional<tinyusdz::Interpolation> *other_local;
  optional<tinyusdz::Interpolation> *this_local;
  
  bVar2 = has_value(this);
  if ((!bVar2) || (bVar2 = has_value(other), bVar2)) {
    bVar2 = has_value(this);
    if ((bVar2) || (bVar2 = has_value(other), !bVar2)) {
      bVar2 = has_value(this);
      if ((bVar2) && (bVar2 = has_value(other), bVar2)) {
        pvVar3 = operator*(other);
        vVar1 = *pvVar3;
        pvVar4 = detail::storage_t<tinyusdz::Interpolation>::value
                           ((storage_t<tinyusdz::Interpolation> *)&this->contained);
        *pvVar4 = vVar1;
      }
    }
    else {
      pvVar3 = operator*(other);
      initialize<tinyusdz::Interpolation>(this,pvVar3);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }